

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

void STRING_delete(STRING_HANDLE handle)

{
  if (handle != (STRING_HANDLE)0x0) {
    free(handle->s);
    free(handle);
    return;
  }
  return;
}

Assistant:

void STRING_delete(STRING_HANDLE handle)
{
    /* Codes_SRS_STRING_07_011: [STRING_delete will not attempt to free anything with a NULL STRING_HANDLE.] */
    if (handle != NULL)
    {
        STRING* value = (STRING*)handle;
        free(value->s);
        value->s = NULL;
        free(value);
    }
}